

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# area_light.h
# Opt level: O1

void __thiscall
CS248::DynamicScene::AreaLight::AreaLight
          (AreaLight *this,LightInfo *light_info,Matrix4x4 *transform)

{
  double dVar1;
  double dVar2;
  double dVar3;
  float fVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double local_b8;
  double dStack_b0;
  double local_a8;
  Vector4D local_78;
  Vector4D local_50;
  
  (this->super_SceneLight)._vptr_SceneLight = (_func_int **)&PTR_get_static_light_00267348;
  (this->spectrum).r = 0.0;
  (this->spectrum).g = 0.0;
  (this->spectrum).b = 0.0;
  (this->position).x = 0.0;
  (this->position).y = 0.0;
  (this->position).z = 0.0;
  (this->direction).x = 0.0;
  (this->direction).y = 0.0;
  (this->direction).z = 0.0;
  (this->dim_x).x = 0.0;
  (this->dim_x).y = 0.0;
  (this->dim_x).z = 0.0;
  (this->dim_y).x = 0.0;
  (this->dim_y).y = 0.0;
  (this->dim_y).z = 0.0;
  (this->spectrum).b = (light_info->spectrum).b;
  fVar4 = (light_info->spectrum).g;
  (this->spectrum).r = (light_info->spectrum).r;
  (this->spectrum).g = fVar4;
  local_78.x = (light_info->position).x;
  local_78.y = (light_info->position).y;
  local_78.z = (light_info->position).z;
  local_78.w = 1.0;
  Matrix4x4::operator*(transform,&local_78);
  Vector4D::to3D(&local_50);
  (this->position).z = local_a8;
  (this->position).x = local_b8;
  (this->position).y = dStack_b0;
  local_78.x = (light_info->direction).x;
  local_78.y = (light_info->direction).y;
  local_78.z = (light_info->direction).z;
  local_78.w = 1.0;
  Matrix4x4::operator*(transform,&local_78);
  Vector4D::to3D(&local_50);
  dVar6 = local_a8 - (this->position).z;
  dVar5 = local_b8 - (this->position).x;
  dVar7 = dStack_b0 - (this->position).y;
  (this->direction).x = dVar5;
  (this->direction).y = dVar7;
  (this->direction).z = dVar6;
  dVar6 = dVar6 * dVar6 + dVar5 * dVar5 + dVar7 * dVar7;
  if (dVar6 < 0.0) {
    dVar6 = sqrt(dVar6);
  }
  else {
    dVar6 = SQRT(dVar6);
  }
  dVar6 = 1.0 / dVar6;
  (this->direction).x = dVar6 * (this->direction).x;
  (this->direction).y = dVar6 * (this->direction).y;
  (this->direction).z = dVar6 * (this->direction).z;
  dVar6 = (light_info->direction).x;
  dVar5 = (light_info->up).x;
  dVar7 = (light_info->direction).y;
  dVar1 = (light_info->direction).z;
  dVar2 = (light_info->up).y;
  dVar3 = (light_info->up).z;
  local_78.x = dVar1 * dVar2 - dVar3 * dVar7;
  local_78.y = dVar6 * dVar3 - dVar5 * dVar1;
  local_78.z = dVar5 * dVar7 - dVar6 * dVar2;
  local_78.w = 1.0;
  Matrix4x4::operator*(transform,&local_78);
  Vector4D::to3D(&local_50);
  dVar6 = (this->position).z;
  dVar7 = (this->position).y;
  (this->dim_x).x = local_b8 - (this->position).x;
  (this->dim_x).y = dStack_b0 - dVar7;
  (this->dim_x).z = local_a8 - dVar6;
  local_78.w = 1.0;
  local_78.x = dVar5;
  local_78.y = dVar2;
  local_78.z = dVar3;
  Matrix4x4::operator*(transform,&local_78);
  Vector4D::to3D(&local_50);
  dVar6 = (this->position).z;
  dVar5 = (this->position).y;
  (this->dim_y).x = local_b8 - (this->position).x;
  (this->dim_y).y = dStack_b0 - dVar5;
  (this->dim_y).z = local_a8 - dVar6;
  return;
}

Assistant:

AreaLight(const Collada::LightInfo& light_info, const Matrix4x4& transform) {
    this->spectrum = light_info.spectrum;
    this->position = (transform * Vector4D(light_info.position, 1)).to3D();
    this->direction =
        (transform * Vector4D(light_info.direction, 1)).to3D() - position;
    this->direction.normalize();

    Vector3D dim_y = light_info.up;
    Vector3D dim_x = cross(light_info.up, light_info.direction);

    this->dim_x = (transform * Vector4D(dim_x, 1)).to3D() - position;
    this->dim_y = (transform * Vector4D(dim_y, 1)).to3D() - position;
  }